

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationbar.cpp
# Opt level: O1

void QtMWidgets::NavigationBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == IndexOfMethod) {
      if ((*_a[1] == currentChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 0;
      }
    }
    else if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        local_1c = *_a[1];
        local_10 = &local_1c;
        local_18 = (void *)0x0;
        QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
        return;
      case 1:
        showScreen((NavigationBar *)_o,*_a[1]);
        return;
      case 2:
        showPreviousScreen((NavigationBar *)_o);
        return;
      case 3:
        showNextScreen((NavigationBar *)_o);
        return;
      }
    }
    return;
  }
  if (_id == 1) {
    puVar1 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
      return;
    }
  }
  else {
    puVar1 = (undefined8 *)*_a;
  }
  *puVar1 = 0;
  return;
}

Assistant:

void QtMWidgets::NavigationBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->showScreen((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 2: _t->showPreviousScreen(); break;
        case 3: _t->showNextScreen(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (NavigationBar::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&NavigationBar::currentChanged)) {
                *result = 0;
                return;
            }
        }
    }
}